

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O1

void __thiscall serial::Serial::flushOutput(Serial *this)

{
  SerialImpl *this_00;
  
  this_00 = this->pimpl_;
  SerialImpl::writeLock(this_00);
  SerialImpl::flushOutput(this->pimpl_);
  SerialImpl::writeUnlock(this_00);
  return;
}

Assistant:

void Serial::flushOutput ()
{
  ScopedWriteLock lock(this->pimpl_);
  pimpl_->flushOutput ();
}